

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool>
               (interval_t *ldata,double *rdata,interval_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t *piVar8;
  idx_t row_idx;
  ulong uVar9;
  idx_t row_idx_00;
  idx_t row_idx_01;
  interval_t left;
  interval_t iVar10;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    piVar8 = &result_data->micros;
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      uVar6 = uVar9;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar6 = (ulong)lsel->sel_vector[uVar9];
      }
      uVar7 = uVar9;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)rsel->sel_vector[uVar9];
      }
      uVar1 = ldata[uVar6].months;
      uVar3 = ldata[uVar6].days;
      left.days = uVar3;
      left.months = uVar1;
      left.micros = ldata[uVar6].micros;
      iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                         (left,rdata[uVar7]);
      ((interval_t *)(piVar8 + -1))->months = (int)iVar10._0_8_;
      ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
      *piVar8 = iVar10.micros;
      piVar8 = piVar8 + 2;
    }
  }
  else {
    piVar8 = &result_data->micros;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      row_idx_00 = row_idx;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)lsel->sel_vector[row_idx];
      }
      row_idx_01 = row_idx;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)rsel->sel_vector[row_idx];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar5) {
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar5) goto LAB_01822ee6;
        uVar2 = ldata[row_idx_00].months;
        uVar4 = ldata[row_idx_00].days;
        iVar10.days = uVar4;
        iVar10.months = uVar2;
        iVar10.micros = ldata[row_idx_00].micros;
        iVar10 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                           (iVar10,rdata[row_idx_01]);
        ((interval_t *)(piVar8 + -1))->months = (int)iVar10._0_8_;
        ((interval_t *)(piVar8 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
        *piVar8 = iVar10.micros;
      }
      else {
LAB_01822ee6:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      piVar8 = piVar8 + 2;
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}